

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

void libxml_xmlErrorFuncHandler(void *ctx,char *msg,...)

{
  char in_AL;
  int iVar1;
  long *plVar2;
  PyObject *pPVar3;
  long *plVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char str [1000];
  undefined8 local_4c8;
  void **local_4c0;
  undefined1 *local_4b8;
  undefined1 local_4a8 [16];
  undefined8 local_498;
  undefined8 local_490;
  undefined8 local_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  undefined8 local_428;
  undefined8 local_418;
  undefined8 local_408;
  char local_3f8 [999];
  undefined1 local_11;
  
  local_4b8 = local_4a8;
  if (in_AL != '\0') {
    local_478 = in_XMM0_Qa;
    local_468 = in_XMM1_Qa;
    local_458 = in_XMM2_Qa;
    local_448 = in_XMM3_Qa;
    local_438 = in_XMM4_Qa;
    local_428 = in_XMM5_Qa;
    local_418 = in_XMM6_Qa;
    local_408 = in_XMM7_Qa;
  }
  local_4c8 = 0x3000000010;
  local_4c0 = &ap[0].overflow_arg_area;
  local_498 = in_RDX;
  local_490 = in_RCX;
  local_488 = in_R8;
  local_480 = in_R9;
  if (libxml_xmlPythonErrorFuncHandler == (PyObject *)0x0) {
    vfprintf(_stderr,msg,&local_4c8);
  }
  else {
    iVar1 = vsnprintf(local_3f8,999,msg,&local_4c8);
    if (0x3e5 < iVar1) {
      local_11 = 0;
    }
    plVar2 = (long *)PyTuple_New(2);
    PyTuple_SetItem(plVar2,0,libxml_xmlPythonErrorFuncCtxt);
    if (libxml_xmlPythonErrorFuncCtxt != (PyObject *)0x0) {
      libxml_xmlPythonErrorFuncCtxt->ob_refcnt = libxml_xmlPythonErrorFuncCtxt->ob_refcnt + 1;
    }
    pPVar3 = libxml_charPtrConstWrap(local_3f8);
    PyTuple_SetItem(plVar2,1,pPVar3);
    plVar4 = (long *)PyEval_CallObjectWithKeywords(libxml_xmlPythonErrorFuncHandler,plVar2,0);
    if ((plVar2 != (long *)0x0) && (*plVar2 = *plVar2 + -1, *plVar2 == 0)) {
      _Py_Dealloc(plVar2);
    }
    if ((plVar4 != (long *)0x0) && (*plVar4 = *plVar4 + -1, *plVar4 == 0)) {
      _Py_Dealloc(plVar4);
    }
  }
  return;
}

Assistant:

static void
libxml_xmlErrorFuncHandler(ATTRIBUTE_UNUSED void *ctx, const char *msg,
                           ...)
{
    va_list ap;
    PyObject *list;
    PyObject *message;
    PyObject *result;
    char str[1000];

#ifdef DEBUG_ERROR
    printf("libxml_xmlErrorFuncHandler(%p, %s, ...) called\n", ctx, msg);
#endif


    if (libxml_xmlPythonErrorFuncHandler == NULL) {
        va_start(ap, msg);
        vfprintf(stderr, msg, ap);
        va_end(ap);
    } else {
        va_start(ap, msg);
        if (vsnprintf(str, 999, msg, ap) >= 998)
	    str[999] = 0;
        va_end(ap);

        list = PyTuple_New(2);
        PyTuple_SetItem(list, 0, libxml_xmlPythonErrorFuncCtxt);
        Py_XINCREF(libxml_xmlPythonErrorFuncCtxt);
        message = libxml_charPtrConstWrap(str);
        PyTuple_SetItem(list, 1, message);
        result = PyEval_CallObject(libxml_xmlPythonErrorFuncHandler, list);
        Py_XDECREF(list);
        Py_XDECREF(result);
    }
}